

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr * __thiscall c4::yml::Tree::val_tag(Tree *this,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  Location loc;
  Location loc_00;
  Location loc_01;
  bool bVar3;
  error_flags eVar4;
  csubstr *pcVar5;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar5 = (csubstr *)(*pcVar2)();
        return pcVar5;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  NVar1 = this->m_buf[node].m_type.type;
  if (((byte)(NVar1 >> 0xb) & (NVar1 & (SEQ|MAP|VAL)) != NOTYPE) == 0) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar5 = (csubstr *)(*pcVar2)();
        return pcVar5;
      }
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4bc5) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x4bc5) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: has_val_tag(node)",0x1f,loc_00);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar5 = (csubstr *)(*pcVar2)();
        return pcVar5;
      }
    }
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_01.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  return &this->m_buf[node].m_val.tag;
}

Assistant:

csubstr    const& val_tag   (size_t node) const { RYML_ASSERT(has_val_tag(node)); return _p(node)->m_val.tag; }